

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  undefined8 uVar7;
  size_t __size;
  char *pcVar8;
  int iVar9;
  long lVar10;
  REF_INT edge30;
  REF_INT edge12;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_INT edge23;
  REF_INT edge01;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  int local_13c;
  int local_138;
  REF_INT local_134;
  void *local_130;
  REF_CELL local_128;
  int local_120;
  int local_11c;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c [27];
  
  ref_cell = ref_subdiv->grid->cell[6];
  iVar9 = ref_cell->max;
  if ((long)iVar9 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x414,
           "ref_subdiv_split_qua","malloc marked_for_removal of REF_INT negative");
    __size = 1;
  }
  else {
    __size = (long)iVar9 * 4;
    local_130 = malloc(__size);
    if (local_130 == (void *)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x414,"ref_subdiv_split_qua","malloc marked_for_removal of REF_INT NULL");
      __size = 2;
      local_130 = (void *)0x0;
    }
    else {
      bVar3 = true;
      if (iVar9 != 0) {
        memset(local_130,0,__size);
      }
    }
  }
  uVar5 = (uint)__size;
  if (bVar3) {
    uVar4 = ref_cell_create(&local_128,ref_cell->type);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x416,"ref_subdiv_split_qua",(ulong)uVar4,"temp cell");
      __size = (size_t)uVar4;
    }
    uVar5 = (uint)__size;
    if (uVar4 == 0) {
      if (0 < ref_cell->max) {
        lVar10 = 0;
        do {
          iVar9 = (int)lVar10;
          if (ref_cell->c2n[(long)iVar9 * (long)ref_cell->size_per] != -1) {
            uVar5 = ref_cell_nodes(ref_cell,iVar9,&local_118);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x419,"ref_subdiv_split_qua",(ulong)uVar5,"nodes");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
            uVar5 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_11c);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41b,"ref_subdiv_split_qua",(ulong)uVar5,"e01");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
            uVar5 = ref_edge_with(ref_subdiv->edge,local_114,local_110,&local_138);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41d,"ref_subdiv_split_qua",(ulong)uVar5,"e12");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
            uVar5 = ref_edge_with(ref_subdiv->edge,local_110,local_10c,&local_120);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x41f,"ref_subdiv_split_qua",(ulong)uVar5,"e23");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
            uVar5 = ref_edge_with(ref_subdiv->edge,local_10c,local_118,&local_13c);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x421,"ref_subdiv_split_qua",(ulong)uVar5,"e30");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
            pRVar2 = ref_subdiv->mark;
            iVar1 = pRVar2[local_11c];
            if ((((iVar1 != 0) && (pRVar2[local_120] != 0)) && (pRVar2[local_138] != 0)) &&
               (pRVar2[local_13c] != 0)) {
              pcVar8 = "all quad edges";
              uVar7 = 0x426;
LAB_0020718a:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,uVar7,"ref_subdiv_split_qua",6,pcVar8);
              return 6;
            }
            if ((iVar1 != pRVar2[local_120]) || (pRVar2[local_138] != pRVar2[local_13c])) {
              pcVar8 = "quad edges not paired";
              uVar7 = 0x42b;
              goto LAB_0020718a;
            }
            if ((iVar1 != 0) && (pRVar2[local_120] != 0)) {
              *(undefined4 *)((long)local_130 + lVar10 * 4) = 1;
              uVar5 = ref_cell_nodes(ref_cell,iVar9,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x431,"ref_subdiv_split_qua",(ulong)uVar5,"nodes");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x434,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_10c,&local_a0);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x437,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_add(local_128,&local_a8,&local_134);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x438,"ref_subdiv_split_qua",(ulong)uVar5,"add");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_nodes(ref_cell,iVar9,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x43a,"ref_subdiv_split_qua",(ulong)uVar5,"nodes");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x43d,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_10c,local_9c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x440,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_add(local_128,&local_a8,&local_134);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x441,"ref_subdiv_split_qua",(ulong)uVar5,"add");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
            }
            if ((ref_subdiv->mark[local_138] != 0) && (ref_subdiv->mark[local_13c] != 0)) {
              *(undefined4 *)((long)local_130 + lVar10 * 4) = 1;
              uVar5 = ref_cell_nodes(ref_cell,iVar9,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x448,"ref_subdiv_split_qua",(ulong)uVar5,"nodes");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,1099,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_10c,local_118,local_9c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x44e,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_add(local_128,&local_a8,&local_134);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x44f,"ref_subdiv_split_qua",(ulong)uVar5,"add");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_nodes(ref_cell,iVar9,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x451,"ref_subdiv_split_qua",(ulong)uVar5,"nodes");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x454,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_subdiv_node_between(ref_subdiv,local_10c,local_118,&local_a8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x457,"ref_subdiv_split_qua",(ulong)uVar5,"mis");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
              uVar5 = ref_cell_add(local_128,&local_a8,&local_134);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x458,"ref_subdiv_split_qua",(ulong)uVar5,"add");
                __size = (size_t)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)__size;
              }
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_cell->max);
      }
      if (0 < ref_cell->max) {
        lVar10 = 0;
        do {
          if (*(int *)((long)local_130 + lVar10 * 4) == 1) {
            uVar5 = ref_cell_remove(ref_cell,(REF_INT)lVar10);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x45e,"ref_subdiv_split_qua",(ulong)uVar5,"remove");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_cell->max);
      }
      if (0 < local_128->max) {
        iVar9 = 0;
        do {
          RVar6 = ref_cell_nodes(local_128,iVar9,&local_118);
          if (RVar6 == 0) {
            uVar5 = ref_subdiv_add_local_cell(ref_subdiv,ref_cell,&local_118);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x461,"ref_subdiv_split_qua",(ulong)uVar5,"add local");
              __size = (size_t)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)__size;
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_128->max);
      }
      uVar5 = ref_cell_free(local_128);
      if (uVar5 == 0) {
        free(local_130);
        uVar5 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x463,"ref_subdiv_split_qua",(ulong)uVar5,"temp ref_cell free");
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge23, edge30;

  ref_cell = ref_grid_qua(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[3], &edge23),
        "e23");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[3], nodes[0], &edge30),
        "e30");
    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "all quad edges");
    if (ref_subdiv_mark(ref_subdiv, edge01) !=
            ref_subdiv_mark(ref_subdiv, edge23) ||
        ref_subdiv_mark(ref_subdiv, edge12) !=
            ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "quad edges not paired");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}